

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O0

void __thiscall llvm::formatv_object_base::format(formatv_object_base *this,raw_ostream *S)

{
  ulong uVar1;
  bool bVar2;
  reference pRVar3;
  size_type sVar4;
  const_reference ppfVar5;
  undefined1 local_80 [8];
  FmtAlign Align;
  value_type W;
  ReplacementItem *R;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_> *__range2;
  raw_ostream *S_local;
  formatv_object_base *this_local;
  
  __end2 = std::vector<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>::begin
                     (&this->Replacements);
  R = (ReplacementItem *)
      std::vector<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>::end
                (&this->Replacements);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_llvm::ReplacementItem_*,_std::vector<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>_>
                                     *)&R), bVar2) {
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_llvm::ReplacementItem_*,_std::vector<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>_>
             ::operator*(&__end2);
    if (pRVar3->Type != Empty) {
      if (pRVar3->Type == Literal) {
        raw_ostream::operator<<(S,pRVar3->Spec);
      }
      else {
        uVar1 = pRVar3->Index;
        sVar4 = std::
                vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                ::size(&this->Adapters);
        if (uVar1 < sVar4) {
          ppfVar5 = std::
                    vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                    ::operator[](&this->Adapters,pRVar3->Index);
          Align._24_8_ = *ppfVar5;
          FmtAlign::FmtAlign((FmtAlign *)local_80,(format_adapter *)Align._24_8_,pRVar3->Where,
                             pRVar3->Align,pRVar3->Pad);
          FmtAlign::format((FmtAlign *)local_80,S,pRVar3->Options);
        }
        else {
          raw_ostream::operator<<(S,pRVar3->Spec);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::ReplacementItem_*,_std::vector<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void format(raw_ostream &S) const {
    for (auto &R : Replacements) {
      if (R.Type == ReplacementType::Empty)
        continue;
      if (R.Type == ReplacementType::Literal) {
        S << R.Spec;
        continue;
      }
      if (R.Index >= Adapters.size()) {
        S << R.Spec;
        continue;
      }

      auto W = Adapters[R.Index];

      FmtAlign Align(*W, R.Where, R.Align, R.Pad);
      Align.format(S, R.Options);
    }
  }